

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O1

precise_unit units::unit_to_the_power_of(string *unit_string,int power,uint64_t match_flags)

{
  unit_data *this;
  pointer pcVar1;
  size_type sVar2;
  precise_unit pVar3;
  precise_unit pVar4;
  precise_unit pVar5;
  precise_unit pVar6;
  precise_unit pVar7;
  precise_unit pVar8;
  int iVar9;
  unit_data uVar10;
  undefined4 extraout_EAX;
  undefined4 extraout_EAX_00;
  size_type sVar11;
  size_t sVar12;
  undefined8 uVar13;
  undefined8 extraout_RAX;
  uint64_t match_flags_00;
  uint uVar14;
  bool bVar15;
  double dVar16;
  double in_XMM1_Qa;
  precise_unit pVar17;
  int index;
  precise_unit a_unit;
  string ustring;
  precise_unit local_108;
  double local_f8;
  int local_ec;
  double local_e8;
  precise_unit local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string local_b0;
  string local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_e8 = (double)CONCAT44(local_e8._4_4_,power);
  uVar14 = ~(uint)match_flags >> 2 & 0x8000;
  local_108.base_units_ = (unit_data)0xfa94a488;
  local_108.commodity_ = 0;
  local_108.multiplier_ = NAN;
  pcVar1 = (unit_string->_M_dataplus)._M_p;
  sVar2 = unit_string->_M_string_length;
  local_ec = (int)sVar2 + -2;
  bVar15 = pcVar1[sVar2 - 1] == ')';
  if (bVar15) {
    segmentcheckReverse(unit_string,'(',&local_ec);
    if (0 < (long)local_ec) {
      bVar15 = pcVar1[local_ec] != '^';
      goto LAB_003b22af;
    }
  }
  else {
LAB_003b22af:
    if (!bVar15) {
      if (((uint)match_flags >> 9 & 1) != 0) {
        cleanUnitString(unit_string,match_flags);
      }
      local_108 = get_unit(unit_string,match_flags);
      if ((NAN(local_108.multiplier_)) && (local_108.base_units_ == (unit_data)0xfa94a488)) {
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"per","");
        sVar12 = findWordOperatorSep(unit_string,(string *)&local_d0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
          operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
        }
        if (sVar12 != 0xffffffffffffffff) {
          pVar5.base_units_ = (unit_data)0x30000000;
          pVar5.commodity_ = 0;
          pVar5.multiplier_ = 1.0;
          return pVar5;
        }
        pcVar1 = (unit_string->_M_dataplus)._M_p;
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_70,pcVar1,pcVar1 + unit_string->_M_string_length);
        local_108 = unit_from_string_internal(&local_70,match_flags - uVar14);
        iVar9 = local_e8._0_4_;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
        uVar13 = local_108._8_8_;
        if ((NAN(local_108.multiplier_)) && (local_108.base_units_ == (unit_data)0xfa94a488)) {
          pVar6.base_units_ = (unit_data)0xfa94a488;
          pVar6.commodity_ = 0;
          pVar6.multiplier_ = NAN;
          return pVar6;
        }
        if (iVar9 == -1) {
          pVar17 = precise_unit::inv(&local_108);
          return pVar17;
        }
        local_108._8_8_ = uVar13;
        if (iVar9 != 1) {
          dVar16 = precise_unit::pow(&local_108,local_108.multiplier_,in_XMM1_Qa);
          pVar3.base_units_ = (unit_data)(int)extraout_RAX;
          pVar3.commodity_ = (int)((ulong)extraout_RAX >> 0x20);
          pVar3.multiplier_ = dVar16;
          return pVar3;
        }
      }
      else {
        if (local_e8._0_4_ == -1) {
          local_f8 = local_108.multiplier_;
          uVar10 = detail::unit_data::inv(&local_108.base_units_);
          uVar14 = ~local_108.commodity_;
          if (local_108.commodity_ == 0) {
            uVar14 = 0;
          }
          pVar17.commodity_ = uVar14;
          pVar17.base_units_ = uVar10;
          pVar17.multiplier_ = 1.0 / local_f8;
          return pVar17;
        }
        if (local_e8._0_4_ != 1) {
          local_f8 = detail::power_const<double>(local_108.multiplier_,local_e8._0_4_);
          detail::unit_data::pow(&local_108.base_units_,local_f8,in_XMM1_Qa);
          pVar8.commodity_ = local_108.commodity_;
          pVar8.base_units_ = (unit_data)extraout_EAX_00;
          pVar8.multiplier_ = local_f8;
          return pVar8;
        }
      }
      pVar7.base_units_ = local_108.base_units_;
      pVar7.commodity_ = local_108.commodity_;
      pVar7.multiplier_ = local_108.multiplier_;
      return pVar7;
    }
  }
  iVar9 = local_ec;
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
            (&local_d0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit_string,
             (long)local_ec + 2,(sVar2 - (long)local_ec) - 3);
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,local_d0._M_dataplus._M_p,
             local_d0._M_dataplus._M_p + local_d0._M_string_length);
  match_flags_00 = match_flags - uVar14;
  local_108 = unit_from_string_internal(&local_90,match_flags_00);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((NAN(local_108.multiplier_)) && (local_108.base_units_ == (unit_data)0xfa94a488)) {
    uVar13._0_4_ = (unit_data)0xfa94a488;
    uVar13._4_4_ = 0;
    dVar16 = NAN;
    if (iVar9 < 0) goto LAB_003b26a2;
    sVar11 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             find_first_of(&local_d0,"(*/^{[",0,6);
    if (sVar11 != 0xffffffffffffffff) {
      dVar16 = NAN;
      goto LAB_003b26a2;
    }
    pcVar1 = (unit_string->_M_dataplus)._M_p;
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b0,pcVar1,pcVar1 + unit_string->_M_string_length);
    local_108 = unit_from_string_internal(&local_b0,match_flags_00);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    if ((NAN(local_108.multiplier_)) &&
       (dVar16 = NAN, local_108.base_units_ == (unit_data)0xfa94a488)) goto LAB_003b26a2;
    local_ec = -1;
  }
  this = &local_108.base_units_;
  if (local_e8._0_4_ != 1) {
    if (local_e8._0_4_ == -1) {
      local_e8 = local_108.multiplier_;
      uVar10 = detail::unit_data::inv(this);
      uVar14 = ~local_108.commodity_;
      if (local_108.commodity_ == 0) {
        uVar14 = 0;
      }
      uVar13 = CONCAT44(uVar14,uVar10);
      local_108.multiplier_ = 1.0 / local_e8;
    }
    else {
      local_f8 = detail::power_const<double>(local_108.multiplier_,local_e8._0_4_);
      detail::unit_data::pow(this,local_f8,in_XMM1_Qa);
      uVar13 = CONCAT44(local_108.commodity_,extraout_EAX);
      local_108.multiplier_ = local_f8;
    }
    local_108.base_units_ = (unit_data)(int)uVar13;
    local_108.commodity_ = (int)((ulong)uVar13 >> 0x20);
  }
  if ((long)local_ec < 0) {
    uVar13 = local_108._8_8_;
    dVar16 = local_108.multiplier_;
  }
  else {
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (&local_50,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit_string,0,
               (long)local_ec);
    local_e0 = unit_from_string_internal((string *)&local_50,match_flags_00);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    uVar13._0_4_ = (unit_data)0x30000000;
    uVar13._4_4_ = 0;
    dVar16 = 1.0;
    if ((!NAN(local_e0.multiplier_)) && (local_e0.base_units_ != (unit_data)0xfa94a488)) {
      local_e8 = local_e0.multiplier_;
      local_f8 = local_108.multiplier_;
      uVar10 = detail::unit_data::operator*(&local_e0.base_units_,this);
      uVar13._4_4_ = local_108.commodity_ | local_e0.commodity_;
      uVar13._0_4_ = uVar10;
      dVar16 = local_e8 * local_f8;
    }
  }
LAB_003b26a2:
  local_f8 = dVar16;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  pVar4.base_units_ = SUB84(uVar13,0);
  pVar4.commodity_ = SUB84(uVar13,4);
  pVar4.multiplier_ = local_f8;
  return pVar4;
}

Assistant:

static precise_unit unit_to_the_power_of(
    std::string unit_string,
    int power,
    std::uint64_t match_flags)
{
    std::uint32_t recursion_modifier = recursion_depth1;
    if ((match_flags & no_recursion) != 0) {
        recursion_modifier = 0;
    }

    precise_unit retunit = precise::invalid;
    bool partialPowerSegment = (unit_string.back() == ')');
    int index = static_cast<int>(unit_string.size() - 2);
    if (partialPowerSegment) {
        segmentcheckReverse(unit_string, '(', index);
        if (index > 0 && unit_string[index] == '^') {
            partialPowerSegment = false;
        }
    }
    if (partialPowerSegment) {
        std::string ustring = unit_string.substr(
            static_cast<size_t>(index) + 2,
            unit_string.size() - static_cast<size_t>(index) - 3);
        retunit = unit_from_string_internal(
            ustring, match_flags - recursion_modifier);
        if (!is_valid(retunit)) {
            if (index >= 0) {
                if (ustring.find_first_of("(*/^{[") == std::string::npos) {
                    retunit = unit_from_string_internal(
                        unit_string, match_flags - recursion_modifier);
                    if (!is_valid(retunit)) {
                        return precise::invalid;
                    }
                    index = -1;
                } else {
                    return precise::invalid;
                }
            } else {
                return precise::invalid;
            }
        }

        if (power == -1) {
            retunit = retunit.inv();
        } else if (power != 1) {
            retunit = retunit.pow(power);
        }

        if (index < 0) {
            return retunit;
        }
        auto a_unit = unit_from_string_internal(
            unit_string.substr(0, index), match_flags - recursion_modifier);
        if (!is_error(a_unit)) {
            return a_unit * retunit;
        }
        return precise::defunit;
    }
    // auto ustring = unit_string.substr(0, pchar + 1);

    if ((match_flags & case_insensitive) != 0) {
        cleanUnitString(unit_string, match_flags);
    }

    retunit = get_unit(unit_string, match_flags);
    if (is_valid(retunit)) {
        if (power == 1) {
            return retunit;
        }
        if (power == -1) {
            return retunit.inv();
        }
        return retunit.pow(power);
    }
    auto fnd = findWordOperatorSep(unit_string, "per");
    if (fnd == std::string::npos) {
        retunit = unit_from_string_internal(
            unit_string, match_flags - recursion_modifier);
        if (!is_valid(retunit)) {
            return precise::invalid;
        }
        if (power == 1) {
            return retunit;
        }
        if (power == -1) {
            return retunit.inv();
        }
        return retunit.pow(power);
    }
    return precise::defunit;
}